

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::detail::Dynamic_Caster<std::exception,_std::logic_error>::cast
          (Dynamic_Caster<std::exception,_std::logic_error> *this,Boxed_Value *t_from)

{
  uint uVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  type_info *ptVar7;
  bool bVar8;
  void *pvVar9;
  reference_wrapper<std::logic_error> obj;
  element_type *peVar10;
  reference_wrapper<const_std::logic_error> obj_00;
  undefined8 *puVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar15;
  Boxed_Value BVar16;
  Type_Info local_48;
  shared_ptr<const_std::logic_error> local_30;
  
  local_48.m_type_info = (type_info *)&std::exception::typeinfo;
  local_48.m_bare_type_info = (type_info *)&std::exception::typeinfo;
  local_48.m_flags = 0;
  bVar8 = Type_Info::bare_equal
                    (&((t_from->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,&local_48);
  if (!bVar8) {
    puVar11 = (undefined8 *)__cxa_allocate_exception(0x38);
    peVar2 = (t_from->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar3 = *(undefined8 *)&(peVar2->m_type_info).m_flags;
    uVar4 = *(undefined4 *)((long)&(peVar2->m_type_info).m_type_info + 4);
    uVar5 = *(undefined4 *)&(peVar2->m_type_info).m_bare_type_info;
    uVar6 = *(undefined4 *)((long)&(peVar2->m_type_info).m_bare_type_info + 4);
    *(undefined4 *)(puVar11 + 1) = *(undefined4 *)&(peVar2->m_type_info).m_type_info;
    *(undefined4 *)((long)puVar11 + 0xc) = uVar4;
    *(undefined4 *)(puVar11 + 2) = uVar5;
    *(undefined4 *)((long)puVar11 + 0x14) = uVar6;
    puVar11[3] = uVar3;
    puVar11[4] = &std::logic_error::typeinfo;
    puVar11[5] = 0x1f;
    puVar11[6] = "Unknown dynamic_cast_conversion";
    *puVar11 = &PTR__bad_cast_003d0098;
    __cxa_throw(puVar11,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
                std::bad_cast::~bad_cast);
  }
  peVar2 = (t_from->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (peVar2->m_type_info).m_flags;
  if (peVar2->m_is_ref == false) {
    if ((uVar1 & 1) == 0) {
      Cast_Helper_Inner<std::shared_ptr<std::exception>_>::cast
                ((Boxed_Value *)&local_48,(Type_Conversions_State *)t_from);
      peVar13 = (element_type *)0x0;
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_48.m_type_info != (type_info *)0x0) {
        peVar10 = (element_type *)
                  __dynamic_cast(local_48.m_type_info,&std::exception::typeinfo,
                                 &std::logic_error::typeinfo,0);
        ptVar7 = local_48.m_bare_type_info;
        peVar13 = (element_type *)0x0;
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (peVar10 != (element_type *)0x0) {
          local_48.m_type_info = (type_info *)0x0;
          local_48.m_bare_type_info = (type_info *)0x0;
          peVar13 = peVar10;
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ptVar7;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info);
      }
      if (peVar13 == (element_type *)0x0) {
        puVar11 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar11 = std::_Rb_tree_rebalance_for_erase;
        __cxa_throw(puVar11,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_30.super___shared_ptr<const_std::logic_error,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar13;
      local_30.super___shared_ptr<const_std::logic_error,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var14;
      sVar15 = Boxed_Value::Object_Data::get<std::logic_error>
                         ((Object_Data *)this,(shared_ptr<std::logic_error> *)&local_30,false);
      _Var12 = sVar15.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    }
    else {
      Cast_Helper_Inner<std::shared_ptr<const_std::exception>_>::cast
                ((Boxed_Value *)&local_48,(Type_Conversions_State *)t_from);
      peVar13 = (element_type *)0x0;
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_48.m_type_info != (type_info *)0x0) {
        peVar10 = (element_type *)
                  __dynamic_cast(local_48.m_type_info,&std::exception::typeinfo,
                                 &std::logic_error::typeinfo,0);
        ptVar7 = local_48.m_bare_type_info;
        peVar13 = (element_type *)0x0;
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (peVar10 != (element_type *)0x0) {
          local_48.m_type_info = (type_info *)0x0;
          local_48.m_bare_type_info = (type_info *)0x0;
          peVar13 = peVar10;
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ptVar7;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info);
      }
      if (peVar13 == (element_type *)0x0) {
        puVar11 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar11 = std::_Rb_tree_rebalance_for_erase;
        __cxa_throw(puVar11,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_30.super___shared_ptr<const_std::logic_error,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar13;
      local_30.super___shared_ptr<const_std::logic_error,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var14;
      sVar15 = Boxed_Value::Object_Data::get<std::logic_error_const>
                         ((Object_Data *)this,&local_30,false);
      _Var12 = sVar15.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    }
    if (local_30.super___shared_ptr<const_std::logic_error,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<const_std::logic_error,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var12._M_pi = extraout_RDX;
    }
  }
  else if ((uVar1 & 1) == 0) {
    pvVar9 = verify_type<void>((Boxed_Value *)peVar2,(type_info *)&std::exception::typeinfo,
                               peVar2->m_data_ptr);
    obj._M_data = (logic_error *)
                  __dynamic_cast(pvVar9,&std::exception::typeinfo,&std::logic_error::typeinfo,0);
    if (obj._M_data == (logic_error *)0x0) {
LAB_002cf152:
      __cxa_bad_cast();
    }
    sVar15 = Boxed_Value::Object_Data::get<std::logic_error>((Object_Data *)this,obj,false);
    _Var12 = sVar15.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  }
  else {
    pvVar9 = verify_type<void>((Boxed_Value *)peVar2,(type_info *)&std::exception::typeinfo,
                               peVar2->m_const_data_ptr);
    obj_00._M_data =
         (logic_error *)
         __dynamic_cast(pvVar9,&std::exception::typeinfo,&std::logic_error::typeinfo,0);
    if (obj_00._M_data == (logic_error *)0x0) goto LAB_002cf152;
    sVar15 = Boxed_Value::Object_Data::get<std::logic_error_const>((Object_Data *)this,obj_00,false)
    ;
    _Var12 = sVar15.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  }
  BVar16.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var12._M_pi;
  BVar16.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar16.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from) {
        if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>())) {
          if (t_from.is_pointer()) {
            // Dynamic cast out the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              return Boxed_Value([&]() {
                if (auto data
                    = std::dynamic_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
                  throw std::bad_cast();
                }
              }());
            } else {
              return Boxed_Value([&]() {
                if (auto data = std::dynamic_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
#ifdef CHAISCRIPT_LIBCPP
                  /// \todo fix this someday after libc++ is fixed.
                  if (std::string(typeid(To).name()).find("Assignable_Proxy_Function") != std::string::npos) {
                    auto from = detail::Cast_Helper<std::shared_ptr<From>>::cast(t_from, nullptr);
                    if (std::string(typeid(*from).name()).find("Assignable_Proxy_Function_Impl") != std::string::npos) {
                      return std::static_pointer_cast<To>(from);
                    }
                  }
#endif
                  throw std::bad_cast();
                }
              }());
            }
          } else {
            // Pull the reference out of the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
              const To &data = dynamic_cast<const To &>(d);
              return Boxed_Value(std::cref(data));
            } else {
              From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
              To &data = dynamic_cast<To &>(d);
              return Boxed_Value(std::ref(data));
            }
          }
        } else {
          throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
        }
      }